

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

void ERR_SAVE_STATE_free(ERR_SAVE_STATE *state)

{
  ulong local_18;
  size_t i;
  ERR_SAVE_STATE *state_local;
  
  if (state != (ERR_SAVE_STATE *)0x0) {
    for (local_18 = 0; local_18 < state->num_errors; local_18 = local_18 + 1) {
      err_clear(state->errors + local_18);
    }
    free(state->errors);
    free(state);
  }
  return;
}

Assistant:

void ERR_SAVE_STATE_free(ERR_SAVE_STATE *state) {
  if (state == NULL) {
    return;
  }
  for (size_t i = 0; i < state->num_errors; i++) {
    err_clear(&state->errors[i]);
  }
  free(state->errors);
  free(state);
}